

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_prune.cpp
# Opt level: O0

bool __thiscall
PruneReplayer::enqueue_create_compute_pipeline
          (PruneReplayer *this,Hash hash,VkComputePipelineCreateInfo *create_info,
          VkPipeline *pipeline)

{
  bool bVar1;
  VkPipeline_T *pVVar2;
  VkPipeline local_38;
  undefined1 local_29;
  VkPipeline *ppVStack_28;
  bool allow_pipeline;
  VkPipeline *pipeline_local;
  VkComputePipelineCreateInfo *create_info_local;
  Hash hash_local;
  PruneReplayer *this_local;
  
  ppVStack_28 = pipeline;
  pipeline_local = (VkPipeline *)create_info;
  create_info_local = (VkComputePipelineCreateInfo *)hash;
  hash_local = (Hash)this;
  pVVar2 = fake_handle<VkPipeline_T*>(hash);
  *ppVStack_28 = pVVar2;
  bVar1 = filter_object(this,RESOURCE_COMPUTE_PIPELINE,(Hash)create_info_local);
  if ((bVar1) && (local_29 = filter_shader_module(this,(Hash)pipeline_local[6]), (bool)local_29)) {
    access_pipeline_layout(this,(Hash)pipeline_local[9]);
    local_38 = pipeline_local[6];
    std::
    unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
    ::insert(&this->accessed_shader_modules,(value_type *)&local_38);
    std::
    unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
    ::insert(&this->accessed_compute_pipelines,(value_type *)&create_info_local);
  }
  return true;
}

Assistant:

bool enqueue_create_compute_pipeline(Hash hash, const VkComputePipelineCreateInfo *create_info, VkPipeline *pipeline) override
	{
		*pipeline = fake_handle<VkPipeline>(hash);

		if (filter_object(RESOURCE_COMPUTE_PIPELINE, hash))
		{
			bool allow_pipeline = filter_shader_module((Hash)create_info->stage.module);

			if (allow_pipeline)
			{
				access_pipeline_layout((Hash) create_info->layout);
				accessed_shader_modules.insert((Hash) create_info->stage.module);
				accessed_compute_pipelines.insert(hash);
			}
		}
		return true;
	}